

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::Equals,true,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  uint64_t uVar2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int64_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  
  puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = 0;
  uVar13 = 0;
  lVar7 = 0;
  do {
    if (uVar6 == count + 0x3f >> 6) {
      return count - lVar7;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar14 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar14 = count;
      }
LAB_01814e48:
      piVar12 = &rdata[uVar13].upper;
      for (; uVar10 = uVar13, uVar13 < uVar14; uVar13 = uVar13 + 1) {
        uVar9 = uVar13;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)sel->sel_vector[uVar13];
        }
        uVar2 = ldata->lower;
        lVar3 = ldata->upper;
        uVar4 = ((hugeint_t *)(piVar12 + -1))->lower;
        lVar5 = *piVar12;
        false_sel->sel_vector[lVar7] = (sel_t)uVar9;
        lVar7 = lVar7 + (ulong)(lVar3 != lVar5 || uVar2 != uVar4);
        piVar12 = piVar12 + 2;
      }
    }
    else {
      uVar9 = puVar1[uVar6];
      uVar14 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar14 = count;
      }
      if (uVar9 == 0xffffffffffffffff) goto LAB_01814e48;
      if (uVar9 == 0) {
        for (; uVar10 = uVar14, uVar13 < uVar14; uVar13 = uVar13 + 1) {
          uVar9 = uVar13;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)sel->sel_vector[uVar13];
          }
          false_sel->sel_vector[lVar7] = (sel_t)uVar9;
          lVar7 = lVar7 + 1;
        }
      }
      else {
        piVar12 = &rdata[uVar13].upper;
        uVar8 = 0;
        for (; uVar10 = uVar13, uVar13 < uVar14; uVar13 = uVar13 + 1) {
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)sel->sel_vector[uVar13];
          }
          uVar11 = 1;
          if ((uVar9 >> (uVar8 & 0x3f) & 1) != 0) {
            uVar11 = (ulong)(ldata->upper != *piVar12 ||
                            ldata->lower != ((hugeint_t *)(piVar12 + -1))->lower);
          }
          false_sel->sel_vector[lVar7] = (sel_t)uVar10;
          lVar7 = lVar7 + uVar11;
          uVar8 = uVar8 + 1;
          piVar12 = piVar12 + 2;
        }
      }
    }
    uVar13 = uVar10;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}